

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O0

void __thiscall IO::Reaction::setArrhenius(Reaction *this,double A,double n,double E,bool reverse)

{
  bool reverse_local;
  double E_local;
  double n_local;
  double A_local;
  Reaction *this_local;
  
  if (reverse) {
    this->flagHasREV_ = true;
    (this->reverseArrhenius_).A = A;
    (this->reverseArrhenius_).n = n;
    (this->reverseArrhenius_).E = E;
  }
  else {
    (this->forwardArrhenius_).A = A;
    (this->forwardArrhenius_).n = n;
    (this->forwardArrhenius_).E = E;
  }
  return;
}

Assistant:

void IO::Reaction::setArrhenius
(
    double A,
    double n,
    double E,
    bool reverse
)
{
    if (reverse)
    {
        flagHasREV_ = true;
        reverseArrhenius_.A = A;
        reverseArrhenius_.n = n;
        reverseArrhenius_.E = E;
    }
    else
    {
        forwardArrhenius_.A = A;
        forwardArrhenius_.n = n;
        forwardArrhenius_.E = E;
    }
}